

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.cc
# Opt level: O0

int __thiscall S2CellId::GetCommonAncestorLevel(S2CellId *this,S2CellId other)

{
  uint64 uVar1;
  uint64 uVar2;
  unsigned_long_long *puVar3;
  ostream *poVar4;
  int *piVar5;
  int local_6c;
  int local_68 [5];
  byte local_51;
  S2LogMessage local_50;
  S2LogMessageVoidify local_39;
  uint64 local_38;
  uint64 local_30;
  ulong local_28;
  unsigned_long_long local_20;
  uint64 bits;
  S2CellId *this_local;
  S2CellId other_local;
  
  bits = (uint64)this;
  this_local = (S2CellId *)other.id_;
  uVar1 = id(this);
  uVar2 = id((S2CellId *)&this_local);
  local_28 = uVar1 ^ uVar2;
  local_30 = lsb(this);
  local_38 = lsb((S2CellId *)&this_local);
  puVar3 = std::max<unsigned_long_long>(&local_30,&local_38);
  puVar3 = std::max<unsigned_long_long>(&local_28,puVar3);
  local_20 = *puVar3;
  local_51 = 0;
  if (local_20 == 0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cell_id.cc"
               ,0xbc,kFatal,(ostream *)&std::cerr);
    local_51 = 1;
    poVar4 = S2LogMessage::stream(&local_50);
    poVar4 = std::operator<<(poVar4,"Check failed: (bits) != (0) ");
    S2LogMessageVoidify::operator&(&local_39,poVar4);
  }
  if ((local_51 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_50);
  }
  local_68[0] = Bits::FindMSBSetNonZero64(local_20);
  local_68[0] = 0x3c - local_68[0];
  local_6c = -1;
  piVar5 = std::max<int>(local_68,&local_6c);
  return *piVar5 >> 1;
}

Assistant:

int S2CellId::GetCommonAncestorLevel(S2CellId other) const {
  // Basically we find the first bit position at which the two S2CellIds
  // differ and convert that to a level.  The max() below is necessary for the
  // case where one S2CellId is a descendant of the other.
  uint64 bits = max(id() ^ other.id(), max(lsb(), other.lsb()));
  S2_DCHECK_NE(bits, 0);  // Because lsb() is non-zero.

  // Compute the position of the most significant bit, and then map the bit
  // position as follows:
  // {0} -> 30, {1,2} -> 29, {3,4} -> 28, ... , {59,60} -> 0, {61,62,63} -> -1.
  return max(60 - Bits::FindMSBSetNonZero64(bits), -1) >> 1;
}